

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

cmTarget * __thiscall cmMakefile::AddNewTarget(cmMakefile *this,TargetType type,string *name)

{
  cmTarget *t;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>,_bool>
  pVar1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>
  local_3d0;
  undefined1 local_1e8 [16];
  PositionType local_1d8;
  
  cmTarget::cmTarget((cmTarget *)local_1e8,name,type,VisibilityNormal,this);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>
  ::pair<cmTarget,_true>(&local_3d0,name,(cmTarget *)local_1e8);
  pVar1 = std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmTarget>,std::allocator<std::pair<std::__cxx11::string_const,cmTarget>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::pair<std::__cxx11::string_const,cmTarget>>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmTarget>,std::allocator<std::pair<std::__cxx11::string_const,cmTarget>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&this->Targets,&local_3d0);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>
  ::~pair(&local_3d0);
  cmTarget::~cmTarget((cmTarget *)local_1e8);
  t = (cmTarget *)
      ((long)pVar1.first.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
             ._M_cur.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
      + 0x28);
  cmGlobalGenerator::IndexTarget(this->GlobalGenerator,t);
  local_1d8 = (this->StateSnapshot).Position.Position;
  local_1e8._0_8_ = (this->StateSnapshot).State;
  local_1e8._8_8_ = (this->StateSnapshot).Position.Tree;
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&local_3d0,(cmStateSnapshot *)local_1e8);
  cmStateDirectory::AddNormalTargetName((cmStateDirectory *)&local_3d0,name);
  return t;
}

Assistant:

cmTarget* cmMakefile::AddNewTarget(cmStateEnums::TargetType type,
                                   const std::string& name)
{
  cmTargets::iterator it =
    this->Targets
      .insert(cmTargets::value_type(
        name, cmTarget(name, type, cmTarget::VisibilityNormal, this)))
      .first;
  this->GetGlobalGenerator()->IndexTarget(&it->second);
  this->GetStateSnapshot().GetDirectory().AddNormalTargetName(name);
  return &it->second;
}